

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Descriptor.cpp
# Opt level: O0

TypeDescriptor * multOperator(TypeDescriptor *leftValue,TypeDescriptor *rightValue)

{
  types *ptVar1;
  NumberDescriptor *this;
  ostream *poVar2;
  StringDescriptor *this_00;
  double dVar3;
  double dVar4;
  __type_conflict _Var5;
  StringDescriptor *stringProduct;
  undefined1 local_140 [4];
  int i;
  string finalValue;
  string local_100;
  string local_e0 [8];
  string stringValue;
  double range;
  string local_98;
  string local_78;
  string local_58;
  NumberDescriptor *numProduct;
  TypeDescriptor *rightValue_local;
  TypeDescriptor *leftValue_local;
  
  numProduct = (NumberDescriptor *)rightValue;
  rightValue_local = leftValue;
  ptVar1 = TypeDescriptor::type(leftValue);
  if ((*ptVar1 == NUMBER) &&
     (ptVar1 = TypeDescriptor::type(&numProduct->super_TypeDescriptor), *ptVar1 == NUMBER)) {
    this = (NumberDescriptor *)operator_new(0x60);
    dVar3 = TypeDescriptor::getNumber(rightValue_local);
    dVar4 = TypeDescriptor::getNumber(&numProduct->super_TypeDescriptor);
    NumberDescriptor::NumberDescriptor(this,dVar3 * dVar4);
    leftValue_local = (TypeDescriptor *)this;
  }
  else {
    ptVar1 = TypeDescriptor::type(rightValue_local);
    if ((*ptVar1 == STRING) &&
       (ptVar1 = TypeDescriptor::type(&numProduct->super_TypeDescriptor), *ptVar1 == STRING)) {
      poVar2 = std::operator<<((ostream *)&std::cout,"TypeDescriptor *multOperator: ");
      TypeDescriptor::getString_abi_cxx11_(&local_58,rightValue_local);
      poVar2 = std::operator<<(poVar2,(string *)&local_58);
      poVar2 = std::operator<<(poVar2," * ");
      TypeDescriptor::getString_abi_cxx11_(&local_78,&numProduct->super_TypeDescriptor);
      poVar2 = std::operator<<(poVar2,(string *)&local_78);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::~string((string *)&local_58);
      poVar2 = std::operator<<((ostream *)&std::cout,"Cannot multiply:");
      TypeDescriptor::getString_abi_cxx11_(&local_98,rightValue_local);
      poVar2 = std::operator<<(poVar2,(string *)&local_98);
      poVar2 = std::operator<<(poVar2," * ");
      TypeDescriptor::getString_abi_cxx11_((string *)&range,&numProduct->super_TypeDescriptor);
      poVar2 = std::operator<<(poVar2,(string *)&range);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)&range);
      std::__cxx11::string::~string((string *)&local_98);
      exit(2);
    }
    dVar3 = TypeDescriptor::getNumber(rightValue_local);
    _Var5 = std::fmod<double,int>(dVar3,1);
    if ((_Var5 != 0.0) || (NAN(_Var5))) {
      dVar3 = TypeDescriptor::getNumber(&numProduct->super_TypeDescriptor);
      _Var5 = std::fmod<double,int>(dVar3,1);
      if ((_Var5 != 0.0) || (NAN(_Var5))) {
        poVar2 = std::operator<<((ostream *)&std::cout,"Unknown type. Terminating...");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        exit(2);
      }
    }
    stringValue.field_2._8_8_ = 0;
    std::__cxx11::string::string(local_e0);
    ptVar1 = TypeDescriptor::type(rightValue_local);
    if (*ptVar1 == NUMBER) {
      stringValue.field_2._8_8_ = TypeDescriptor::getNumber(rightValue_local);
      TypeDescriptor::getString_abi_cxx11_(&local_100,&numProduct->super_TypeDescriptor);
      std::__cxx11::string::operator=(local_e0,(string *)&local_100);
      std::__cxx11::string::~string((string *)&local_100);
    }
    else {
      stringValue.field_2._8_8_ = TypeDescriptor::getNumber(&numProduct->super_TypeDescriptor);
      TypeDescriptor::getString_abi_cxx11_
                ((string *)((long)&finalValue.field_2 + 8),rightValue_local);
      std::__cxx11::string::operator=(local_e0,(string *)(finalValue.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(finalValue.field_2._M_local_buf + 8));
    }
    std::__cxx11::string::string((string *)local_140);
    for (stringProduct._4_4_ = 0; (double)stringProduct._4_4_ < (double)stringValue.field_2._8_8_;
        stringProduct._4_4_ = stringProduct._4_4_ + 1) {
      std::__cxx11::string::operator+=((string *)local_140,local_e0);
    }
    this_00 = (StringDescriptor *)operator_new(0x78);
    StringDescriptor::StringDescriptor(this_00,(string *)local_140);
    leftValue_local = (TypeDescriptor *)this_00;
    std::__cxx11::string::~string((string *)local_140);
    std::__cxx11::string::~string(local_e0);
  }
  return leftValue_local;
}

Assistant:

TypeDescriptor *multOperator(TypeDescriptor *leftValue, TypeDescriptor *rightValue){
    if(leftValue->type() == TypeDescriptor::NUMBER
    && rightValue->type() == TypeDescriptor::NUMBER){
        auto *numProduct = new  NumberDescriptor(leftValue->getNumber() * rightValue->getNumber());
        //std::cout << "TypeDescriptor *multOperator: " << leftValue->getNumber() << " * " << rightValue->getNumber() << std::endl;
        return numProduct;
    }else if(leftValue->type() == TypeDescriptor::STRING
    && rightValue->type() == TypeDescriptor::STRING){
        std::cout << "TypeDescriptor *multOperator: " << leftValue->getString()  << " * " << rightValue->getString()  << std::endl;
        std::cout << "Cannot multiply:" << leftValue->getString()  << " * " << rightValue->getString()  << std::endl;
        exit(2);
    }else{
        if(std::fmod(leftValue->getNumber(),1) == 0
        ||std::fmod(rightValue->getNumber(),1) == 0){
            double range = 0;
            std::string stringValue;
            if(leftValue->type() == TypeDescriptor::NUMBER){
                range = leftValue->getNumber();
                stringValue = rightValue->getString();
            }
            else{
                range = rightValue->getNumber();
                stringValue = leftValue->getString();
            }
            std::string finalValue;
            for(int i = 0; i < range; i++){
                finalValue += stringValue;
            }
            auto *stringProduct = new StringDescriptor(finalValue);
            return stringProduct;
        }
        else{
            std::cout << "Unknown type. Terminating..." << std::endl;
            exit(2);
        }
    }
}